

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int btreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  int *piVar1;
  ushort uVar2;
  undefined2 uVar3;
  Pgno PVar4;
  BtShared *pBt;
  Pager *pPager;
  MemPage *pMVar5;
  sqlite3 *psVar6;
  _func_int_void_ptr_int *p_Var7;
  Wal *pWVar8;
  uint uVar9;
  uint uVar10;
  char cVar11;
  u8 uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  MemPage *pPage1_1;
  BtLock *pBVar17;
  u16 uVar18;
  Btree *pBVar19;
  u32 uVar20;
  uint uVar21;
  u8 *puVar22;
  uint uVar23;
  uint uVar24;
  Wal *pWVar25;
  undefined1 auVar26 [16];
  MemPage *pPage1;
  int local_54;
  Btree *local_50;
  uint *local_48;
  u32 *local_40;
  MemPage *local_38;
  
  pBt = p->pBt;
  pPager = pBt->pPager;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  if ((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) {
LAB_0013a99a:
    if ((uint *)pSchemaVersion != (uint *)0x0) {
      uVar14 = *(uint *)(pBt->pPage1->aData + 0x28);
      *pSchemaVersion =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
    }
    uVar14 = 0;
    if (((wrflag != 0) && (iVar15 = p->db->nSavepoint, pPager->nSavepoint < iVar15)) &&
       (pPager->useJournal != '\0')) {
      uVar14 = pagerOpenSavepoint(pPager,iVar15);
    }
    goto LAB_0013a9dc;
  }
  if (((p->db->flags & 0x2000000) != 0) && (pPager->readOnly == '\0')) {
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0xfe;
  }
  local_48 = (uint *)pSchemaVersion;
  if ((wrflag != 0) && (uVar14 = 8, (pBt->btsFlags & 1) != 0)) goto LAB_0013a9dc;
  cVar11 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar11 < '\0') goto LAB_0013a30d;
  }
  else if ((cVar11 < '\0') || (pBt->inTransaction == '\x02')) {
LAB_0013a30d:
    pBVar19 = pBt->pWriter;
LAB_0013a315:
    uVar14 = 0x106;
    if (pBVar19->db != (sqlite3 *)0x0) goto LAB_0013a9dc;
  }
  else if (1 < wrflag) {
    for (pBVar17 = pBt->pLock; pBVar17 != (BtLock *)0x0; pBVar17 = pBVar17->pNext) {
      pBVar19 = pBVar17->pBtree;
      if (pBVar19 != p) goto LAB_0013a315;
    }
  }
  uVar14 = querySharedCacheTableLock(p,1,'\x01');
  if (uVar14 == 0) {
    uVar2 = pBt->btsFlags;
    pBt->btsFlags = uVar2 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar2 | 0x10;
    }
    local_40 = &pBt->pageSize;
    uVar14 = 0;
    local_50 = p;
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        do {
          uVar14 = sqlite3PagerSharedLock(pBt->pPager);
          if ((uVar14 != 0) ||
             (uVar14 = btreeGetPage(pBt,1,&local_38,0), pMVar5 = local_38, uVar14 != 0))
          goto LAB_0013a7f6;
          puVar22 = local_38->aData;
          uVar14 = *(uint *)(puVar22 + 0x1c);
          uVar21 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                   uVar14 << 0x18;
          uVar16 = pBt->pPager->dbSize;
          if ((uVar21 == 0) || (*(int *)(puVar22 + 0x18) != *(int *)(puVar22 + 0x5c))) {
            uVar21 = uVar16;
          }
          if (((pBt->db->flags & 0x2000000) == 0) && (uVar21 != 0)) {
            auVar26[0] = -(*puVar22 == 'S');
            auVar26[1] = -(puVar22[1] == 'Q');
            auVar26[2] = -(puVar22[2] == 'L');
            auVar26[3] = -(puVar22[3] == 'i');
            auVar26[4] = -(puVar22[4] == 't');
            auVar26[5] = -(puVar22[5] == 'e');
            auVar26[6] = -(puVar22[6] == ' ');
            auVar26[7] = -(puVar22[7] == 'f');
            auVar26[8] = -(puVar22[8] == 'o');
            auVar26[9] = -(puVar22[9] == 'r');
            auVar26[10] = -(puVar22[10] == 'm');
            auVar26[0xb] = -(puVar22[0xb] == 'a');
            auVar26[0xc] = -(puVar22[0xc] == 't');
            auVar26[0xd] = -(puVar22[0xd] == ' ');
            auVar26[0xe] = -(puVar22[0xe] == '3');
            auVar26[0xf] = -(puVar22[0xf] == '\0');
            uVar23 = 0x1a;
            uVar14 = uVar23;
            if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
              if (2 < puVar22[0x12]) {
                *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
              }
              if (puVar22[0x13] < 3) {
                if ((puVar22[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                  local_54 = 0;
                  uVar14 = sqlite3PagerOpenWal(pBt->pPager,&local_54);
                  if (uVar14 == 0) {
                    if (local_54 != 0) goto LAB_0013a4d0;
                    releasePageOne((MemPage *)pMVar5->pDbPage);
                    goto LAB_0013a66e;
                  }
                }
                else {
LAB_0013a4d0:
                  uVar14 = uVar23;
                  if (puVar22[0x17] == ' ' && *(short *)(puVar22 + 0x15) == 0x2040) {
                    uVar10 = (uint)puVar22[0x10] * 0x100;
                    uVar9 = (uint)puVar22[0x11] * 0x10000;
                    if ((0xffff00ff < (uVar9 + uVar10) - 0x10001) &&
                       (uVar24 = uVar9 | uVar10, ((uVar10 + uVar9) - 1 & uVar24) == 0)) {
                      bVar13 = puVar22[0x14];
                      uVar20 = uVar24 - bVar13;
                      if (uVar24 != *local_40) {
                        releasePageOne((MemPage *)pMVar5->pDbPage);
                        pBt->usableSize = uVar20;
                        pBt->pageSize = uVar24;
                        *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                        if (pBt->pTmpSpace != (u8 *)0x0) {
                          puVar22 = pBt->pTmpSpace + -4;
                          pBt->pTmpSpace = puVar22;
                          pcache1Free(puVar22);
                          pBt->pTmpSpace = (u8 *)0x0;
                        }
                        uVar14 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar13);
                        if (uVar14 == 0) goto LAB_0013a66e;
                        goto LAB_0013a7f6;
                      }
                      if ((uVar16 < uVar21) && (uVar21 = uVar16, (pBt->db->flags & 0x10000001) != 1)
                         ) {
                        uVar14 = 0xb;
                        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11cac,
                                    "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c"
                                   );
                      }
                      else if (0x1df < uVar20) {
                        *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                        pBt->pageSize = uVar24;
                        pBt->usableSize = uVar20;
                        uVar14 = *(uint *)(puVar22 + 0x34);
                        pBt->autoVacuum =
                             ((uVar14 >> 0x18 != 0 || (uVar14 & 0xff0000) != 0) ||
                             (uVar14 & 0xff00) != 0) || (uVar14 & 0xff) != 0;
                        uVar14 = *(uint *)(puVar22 + 0x40);
                        pBt->incrVacuum =
                             ((uVar14 >> 0x18 != 0 || (uVar14 & 0xff0000) != 0) ||
                             (uVar14 & 0xff00) != 0) || (uVar14 & 0xff) != 0;
                        goto LAB_0013a59c;
                      }
                    }
                  }
                }
              }
            }
            releasePageOne((MemPage *)pMVar5->pDbPage);
            pBt->pPage1 = (MemPage *)0x0;
            goto LAB_0013a7f6;
          }
          uVar20 = pBt->usableSize;
          uVar21 = 0;
LAB_0013a59c:
          iVar15 = (uVar20 * 0x40 - 0x300) / 0xff - 0x17;
          pBt->maxLocal = (ushort)iVar15;
          uVar18 = (short)((uVar20 * 0x20 - 0x180) / 0xff) - 0x17;
          pBt->minLocal = uVar18;
          pBt->maxLeaf = (short)uVar20 - 0x23;
          pBt->minLeaf = uVar18;
          if (0x7e < (ushort)iVar15) {
            iVar15 = 0x7f;
          }
          pBt->max1bytePayload = (u8)iVar15;
          pBt->pPage1 = pMVar5;
          pBt->nPage = uVar21;
LAB_0013a66e:
        } while (pBt->pPage1 == (MemPage *)0x0);
        uVar14 = 0;
      }
      if ((wrflag == 0) || (uVar14 != 0)) {
LAB_0013a79a:
        p = local_50;
        if (uVar14 == 0) {
          if ((local_50->inTrans == '\0') &&
             (pBt->nTransaction = pBt->nTransaction + 1, local_50->sharable != '\0')) {
            (local_50->lock).eLock = '\x01';
            (local_50->lock).pNext = pBt->pLock;
            pBt->pLock = &local_50->lock;
          }
          bVar13 = 2 - (wrflag == 0);
          local_50->inTrans = bVar13;
          if (pBt->inTransaction < bVar13) {
            pBt->inTransaction = bVar13;
          }
          pSchemaVersion = (int *)local_48;
          if (wrflag == 0) goto LAB_0013a99a;
          pMVar5 = pBt->pPage1;
          pBt->pWriter = local_50;
          uVar3 = pBt->btsFlags;
          pBt->btsFlags = (ushort)(1 < wrflag) << 6 | uVar3 & 0xffbf;
          uVar14 = *(uint *)(pMVar5->aData + 0x1c);
          if (pBt->nPage ==
              (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18))
          goto LAB_0013a99a;
          uVar14 = sqlite3PagerWrite(pMVar5->pDbPage);
          if (uVar14 != 0) break;
          uVar14 = pBt->nPage;
          *(uint *)(pMVar5->aData + 0x1c) =
               uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
          pSchemaVersion = (int *)local_48;
          goto LAB_0013a99a;
        }
LAB_0013a7f6:
        uVar12 = pBt->inTransaction;
      }
      else {
        uVar14 = 8;
        if ((pBt->btsFlags & 1) != 0) goto LAB_0013a7f6;
        uVar16 = pPager->errCode;
        if (uVar16 == 0) {
          pPager->subjInMemory = local_50->db->temp_store == '\x02';
          if (pPager->eState != '\x01') {
LAB_0013a78f:
            uVar14 = newDatabase(pBt);
            goto LAB_0013a79a;
          }
          pWVar25 = pPager->pWal;
          if (pWVar25 == (Wal *)0x0) {
            uVar16 = pagerLockDb(pPager,2);
            if (uVar16 != 0 || wrflag < 2) {
LAB_0013a76a:
              if (uVar16 != 0) goto LAB_0013a3b3;
LAB_0013a772:
              pPager->eState = '\x02';
              PVar4 = pPager->dbSize;
              pPager->dbHintSize = PVar4;
              pPager->dbFileSize = PVar4;
              pPager->dbOrigSize = PVar4;
              pPager->journalOff = 0;
              goto LAB_0013a78f;
            }
            do {
              uVar16 = pagerLockDb(pPager,4);
              if (uVar16 != 5) goto LAB_0013a76a;
              iVar15 = (*pPager->xBusyHandler)(pPager->pBusyHandlerArg);
              uVar14 = 5;
            } while (iVar15 != 0);
          }
          else {
            if ((pPager->exclusiveMode != '\0') && (pWVar25->exclusiveMode == '\0')) {
              uVar16 = pagerLockDb(pPager,4);
              if (uVar16 != 0) goto LAB_0013a3b3;
              pWVar8 = pPager->pWal;
              pWVar25 = pWVar8;
              if (pWVar8->exclusiveMode == '\0') {
                (*pWVar8->pDbFd->pMethods->xShmLock)(pWVar8->pDbFd,pWVar8->readLock + 3,1,5);
                pWVar25 = pPager->pWal;
              }
              pWVar8->exclusiveMode = '\x01';
            }
            if (pWVar25->readOnly == '\0') {
              if ((pWVar25->exclusiveMode == '\0') &&
                 (uVar16 = (*pWVar25->pDbFd->pMethods->xShmLock)(pWVar25->pDbFd,0,1,10), uVar16 != 0
                 )) goto LAB_0013a3b3;
              pWVar25->writeLock = '\x01';
              iVar15 = bcmp(&pWVar25->hdr,*pWVar25->apWiData,0x30);
              if (iVar15 == 0) goto LAB_0013a772;
              if (pWVar25->exclusiveMode == '\0') {
                (*pWVar25->pDbFd->pMethods->xShmLock)(pWVar25->pDbFd,0,1,9);
              }
              pWVar25->writeLock = '\0';
              goto LAB_0013a3c1;
            }
          }
          goto LAB_0013a7f6;
        }
LAB_0013a3b3:
        uVar14 = uVar16;
        if (uVar16 != 0x205) goto LAB_0013a7f6;
LAB_0013a3c1:
        uVar12 = pBt->inTransaction;
        uVar14 = (uint)(uVar12 != '\0') << 9 | 5;
      }
      if ((uVar12 == '\0') && (pMVar5 = pBt->pPage1, pMVar5 != (MemPage *)0x0)) {
        pBt->pPage1 = (MemPage *)0x0;
        releasePageOne((MemPage *)pMVar5->pDbPage);
      }
      p = local_50;
      if (((char)uVar14 != '\x05') || (pBt->inTransaction != '\0')) break;
      psVar6 = pBt->db;
      p_Var7 = (psVar6->busyHandler).xBusyHandler;
      if ((p_Var7 == (_func_int_void_ptr_int *)0x0) ||
         (iVar15 = (psVar6->busyHandler).nBusy, iVar15 < 0)) break;
      iVar15 = (*p_Var7)((psVar6->busyHandler).pBusyArg,iVar15);
      if (iVar15 == 0) goto LAB_0013a8e4;
      piVar1 = &(psVar6->busyHandler).nBusy;
      *piVar1 = *piVar1 + 1;
    } while( true );
  }
LAB_0013a9dc:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return uVar14;
LAB_0013a8e4:
  (psVar6->busyHandler).nBusy = -1;
  goto LAB_0013a9dc;
}

Assistant:

static SQLITE_NOINLINE int btreeBeginTrans(
  Btree *p,                 /* The btree in which to start the transaction */
  int wrflag,               /* True to start a write transaction */
  int *pSchemaVersion       /* Put schema version number here, if not NULL */
){
  BtShared *pBt = p->pBt;
  Pager *pPager = pBt->pPager;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase)
   && sqlite3PagerIsreadonly(pPager)==0
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on
  ** page 1. So if some other shared-cache client already has a write-lock
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    sqlite3PagerWalDb(pPager, p->db);

#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    /* If transitioning from no transaction directly to a write transaction,
    ** block for the WRITER lock first if possible. */
    if( pBt->pPage1==0 && wrflag ){
      assert( pBt->inTransaction==TRANS_NONE );
      rc = sqlite3PagerWalWriteLock(pPager, 1);
      if( rc!=SQLITE_BUSY && rc!=SQLITE_OK ) break;
    }
#endif

    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pPager, wrflag>1, sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }

    if( rc!=SQLITE_OK ){
      (void)sqlite3PagerWalWriteLock(pPager, 0);
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerWalDb(pPager, 0);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}